

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusxml2cpp.cpp
# Opt level: O0

QTextStream * __thiscall
QDBusXmlToCpp::writeHeader(QDBusXmlToCpp *this,QTextStream *ts,bool changesWillBeLost)

{
  QTextStream *pQVar1;
  byte in_DL;
  QTextStream *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  QFileInfo local_28 [8];
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (QTextStream *)
           QTextStream::operator<<
                     (in_RSI,
                      "/*\n * This file was generated by qdbusxml2cpp version 0.8\n * Source file was "
                     );
  QFileInfo::QFileInfo(local_28,(QString *)(in_RDI + 0x48));
  QFileInfo::fileName();
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,(QString *)local_20);
  QTextStream::operator<<
            (pQVar1,
             "\n *\n * qdbusxml2cpp is Copyright (C) The Qt Company Ltd. and other contributors.\n *\n * This is an auto-generated file.\n"
            );
  QString::~QString((QString *)0x105902);
  QFileInfo::~QFileInfo(local_28);
  if ((in_DL & 1) == 0) {
    QTextStream::operator<<
              (in_RSI,
               " * This file may have been hand-edited. Look for HAND-EDIT comments\n * before re-generating it.\n"
              );
  }
  else {
    QTextStream::operator<<(in_RSI," * Do not edit! All changes made to it will be lost.\n");
  }
  QTextStream::operator<<(in_RSI," */\n\n");
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RSI;
  }
  __stack_chk_fail();
}

Assistant:

QTextStream &QDBusXmlToCpp::writeHeader(QTextStream &ts, bool changesWillBeLost)
{
    ts << "/*\n"
          " * This file was generated by " PROGRAMNAME " version " PROGRAMVERSION "\n"
          " * Source file was " << QFileInfo(inputFile).fileName() << "\n"
          " *\n"
          " * " PROGRAMNAME " is " PROGRAMCOPYRIGHT "\n"
          " *\n"
          " * This is an auto-generated file.\n";

    if (changesWillBeLost)
        ts << " * Do not edit! All changes made to it will be lost.\n";
    else
        ts << " * This file may have been hand-edited. Look for HAND-EDIT comments\n"
              " * before re-generating it.\n";

    ts << " */\n\n";

    return ts;
}